

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

optional<pbrt::BSDFSample> * __thiscall
pbrt::DielectricBxDF::Sample_f
          (DielectricBxDF *this,Vector3f wo,Float uc,Point2f u,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  Vector3f w;
  Vector3f w_00;
  Vector3<float> v;
  Vector3<float> v2;
  Vector3<float> v2_00;
  Vector3f wm_00;
  Vector3f wm_01;
  Vector3<float> v1;
  Vector3f wi_00;
  Vector3<float> v1_00;
  Vector3f wi_01;
  Vector3f wi_02;
  Vector3f w_01;
  Vector3f w_02;
  Vector3f wo_00;
  Vector3f wo_01;
  SampledSpectrum f_00;
  Vector3f w_03;
  Vector3f n;
  Vector3f w_04;
  Vector3f wo_02;
  Vector3<float> w_05;
  Vector3<float> v_00;
  Vector3<float> w_06;
  Vector3<float> v_01;
  Normal3f n_00;
  Normal3f n_01;
  Vector3f wi_03;
  Vector3f wi_04;
  Vector3<float> w_07;
  Vector3<float> v_02;
  Vector3<float> w_08;
  Vector3<float> v_03;
  Vector3f wp;
  Vector3f w_09;
  Vector3f wi_05;
  SampledSpectrum f_01;
  Vector3f w_10;
  Vector3f w_11;
  Vector3f wp_00;
  Vector3f w_12;
  Vector3<float> w_13;
  Vector3<float> v_04;
  Vector3f wi_06;
  SampledSpectrum f_02;
  Vector3f wi_07;
  SampledSpectrum f_03;
  Vector3f w_14;
  bool bVar1;
  enable_if_t<std::is_floating_point_v<float>,_bool> eVar2;
  int iVar3;
  int iVar4;
  BxDFReflTransFlags in_ECX;
  int in_EDX;
  float *in_RSI;
  optional<pbrt::BSDFSample> *in_RDI;
  BSDFSample *v_05;
  long *in_FS_OFFSET;
  Float FVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [56];
  undefined1 auVar10 [64];
  float in_XMM1_Da;
  float in_XMM2_Da;
  undefined1 in_ZMM3 [64];
  Vector3f VVar12;
  SampledSpectrum ft_1;
  Float dwm_dwi;
  Float denom;
  bool tir;
  Vector3f wi_3;
  Float etap_1;
  SampledSpectrum f;
  Vector3f wi_2;
  Float pdf;
  Float pt_1;
  Float pr_1;
  Float T_1;
  Float R_1;
  Vector3f wm;
  SampledSpectrum ft;
  bool valid;
  Float etap;
  Vector3f wi_1;
  SampledSpectrum fr;
  Vector3f wi;
  Float pt;
  Float pr;
  Float T;
  Float R;
  BSDFSample *in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff794;
  Float in_stack_fffffffffffff79c;
  Float in_stack_fffffffffffff7a0;
  float in_stack_fffffffffffff7a4;
  PixelAccumFunc in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b8;
  undefined4 in_stack_fffffffffffff7bc;
  undefined4 in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7c4;
  float in_stack_fffffffffffff7cc;
  optional<pbrt::BSDFSample> *poVar13;
  char *in_stack_fffffffffffff7e8;
  float in_stack_fffffffffffff7f0;
  LogLevel in_stack_fffffffffffff7f4;
  undefined8 in_stack_fffffffffffff7f8;
  float in_stack_fffffffffffff800;
  undefined8 in_stack_fffffffffffff808;
  float in_stack_fffffffffffff810;
  float fStack_7ec;
  TrowbridgeReitzDistribution *in_stack_fffffffffffff820;
  Tuple3<pbrt::Vector3,_float> in_stack_fffffffffffff838;
  undefined4 in_stack_fffffffffffff868;
  undefined4 in_stack_fffffffffffff86c;
  float in_stack_fffffffffffff870;
  undefined4 in_stack_fffffffffffff888;
  undefined4 in_stack_fffffffffffff88c;
  float in_stack_fffffffffffff890;
  Vector3f *in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8dc;
  Float in_stack_fffffffffffff8e4;
  undefined4 in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff8fc;
  float in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff91c;
  float in_stack_fffffffffffff920;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined4 in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa7c;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  float in_stack_fffffffffffffaa0;
  __1 local_541;
  undefined8 local_540;
  undefined4 local_538;
  undefined8 local_530;
  float local_528;
  undefined8 local_520;
  float local_518;
  undefined8 local_510;
  float local_508;
  undefined8 local_504;
  undefined4 local_4fc;
  undefined8 local_4f8;
  float local_4f0;
  byte local_4e9;
  undefined8 local_4e8;
  float local_4e0;
  float local_4dc;
  undefined8 local_4d8;
  float local_4d0;
  undefined8 local_4c8;
  float local_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  BSDFSample local_49c;
  undefined8 local_470;
  float local_468;
  undefined8 local_460;
  float local_458;
  undefined8 local_450;
  float local_448;
  undefined8 local_440;
  float local_438;
  undefined8 local_430;
  float local_428;
  undefined8 local_420;
  float local_418;
  undefined8 local_410;
  float local_408;
  undefined8 local_400;
  float local_3f8;
  undefined8 local_3f0;
  float local_3e8;
  undefined8 local_3e0;
  float local_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  float local_3b8;
  undefined8 local_3b0;
  float local_3a8;
  undefined8 local_3a0;
  float local_398;
  undefined8 local_390;
  float local_388;
  undefined8 local_380;
  float local_378;
  undefined8 local_370;
  float local_368;
  undefined8 local_360;
  float local_358;
  undefined8 local_350;
  float local_348;
  undefined8 local_340;
  float local_338;
  undefined8 local_330;
  float local_328;
  undefined8 local_320;
  float local_318;
  undefined8 local_310;
  float local_308;
  undefined8 local_300;
  float local_2f8;
  undefined8 local_2f0;
  float local_2e8;
  undefined8 local_2e0;
  float local_2d8;
  undefined8 local_2d0;
  float local_2c8;
  undefined8 local_2c0;
  float local_2b8;
  undefined8 local_2b0;
  float local_2a8;
  float local_2a0;
  float local_29c;
  Float local_298;
  float local_294;
  undefined8 local_290;
  float local_288;
  undefined8 local_280;
  float local_278;
  undefined8 local_270;
  float local_268;
  undefined8 local_260;
  float local_258;
  Float local_254;
  undefined8 local_250;
  float local_248;
  undefined8 local_240;
  float local_238;
  undefined8 local_230;
  undefined8 local_228;
  float local_220;
  undefined8 local_218;
  float local_210;
  undefined8 local_208;
  float local_200;
  undefined8 local_1f8;
  float local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  BSDFSample local_1d4;
  undefined8 local_1a8;
  float local_1a0;
  undefined8 local_198;
  float local_190;
  undefined8 local_18c;
  undefined8 uStack_184;
  __0 local_169;
  undefined8 local_168;
  undefined4 local_160;
  undefined8 local_158;
  float local_150;
  undefined8 local_144;
  undefined4 local_13c;
  undefined8 local_138;
  float local_130;
  byte local_129;
  float local_128;
  undefined8 local_124;
  float local_11c;
  undefined8 local_118;
  float local_110;
  undefined8 local_108;
  float local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  BSDFSample local_dc;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  float local_78;
  float local_74;
  Float local_70;
  float local_6c;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  Float local_48;
  BxDFReflTransFlags local_44;
  int local_40;
  float local_3c;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_18;
  float local_10;
  undefined1 auVar9 [64];
  
  local_28 = vmovlpd_avx(in_ZMM0._0_16_);
  local_30 = vmovlpd_avx(in_ZMM3._0_16_);
  fVar6 = SUB84(in_RSI,0);
  iVar3 = (int)((ulong)in_RSI >> 0x20);
  poVar13 = in_RDI;
  local_44 = in_ECX;
  local_40 = in_EDX;
  local_3c = in_XMM2_Da;
  local_18 = local_28;
  local_10 = in_XMM1_Da;
  if (((*in_RSI == 1.0) && (!NAN(*in_RSI))) ||
     (bVar1 = TrowbridgeReitzDistribution::EffectivelySmooth
                        ((TrowbridgeReitzDistribution *)0x872415), bVar1)) {
    local_50 = local_10;
    local_58 = local_18;
    local_60 = local_10;
    local_68 = local_18;
    w_14.super_Tuple3<pbrt::Vector3,_float>.z = local_10;
    w_14.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_18;
    w_14.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_18._4_4_;
    CosTheta(w_14);
    local_70 = FrDielectric(in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c);
    local_74 = 1.0 - local_70;
    local_6c = local_74;
    local_48 = local_70;
    iVar3 = operator&(local_44,Reflection);
    if (iVar3 == 0) {
      local_70 = 0.0;
    }
    iVar3 = operator&(local_44,Transmission);
    if (iVar3 == 0) {
      local_74 = 0.0;
    }
    if (((local_70 != 0.0) || (NAN(local_70))) || ((local_74 != 0.0 || (NAN(local_74))))) {
      if (local_70 / (local_70 + local_74) <= local_3c) {
        Vector3<float>::Vector3((Vector3<float> *)0x87270a);
        local_130 = local_10;
        local_138 = local_18;
        Normal3<float>::Normal3
                  ((Normal3<float> *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                   (float)((ulong)in_stack_fffffffffffff788 >> 0x20),
                   SUB84(in_stack_fffffffffffff788,0),0.0);
        local_150 = local_130;
        local_158 = local_138;
        local_160 = local_13c;
        local_168 = local_144;
        wi_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff91c;
        wi_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff918;
        wi_03.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff920;
        n_00.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffff8fc;
        n_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffff8f8;
        n_00.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff900;
        local_129 = Refract(wi_03,n_00,in_stack_fffffffffffff8e4,
                            (Float *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                            in_stack_fffffffffffff8d0);
        if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
             ::reg == '\0') &&
           (iVar3 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                         ::reg), iVar3 != 0)) {
          Sample_f(pbrt::Vector3,float,pbrt::Point2,pbrt::TransportMode,pbrt::BxDFReflTransFlags)_const
          ::$_0::operator_cast_to_function_pointer(&local_169);
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0)
                     ,(AccumFunc)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                     in_stack_fffffffffffff7b0);
          __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                               ::reg);
        }
        *(long *)(*in_FS_OFFSET + -0x78) = *(long *)(*in_FS_OFFSET + -0x78) + 1;
        if ((local_129 & 1) == 0) {
          *(long *)(*in_FS_OFFSET + -0x80) = *(long *)(*in_FS_OFFSET + -0x80) + 1;
        }
        if ((local_129 & 1) == 0) {
          memset(in_RDI,0,0x30);
          pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
        }
        else {
          local_190 = local_11c;
          local_198 = local_124;
          local_1a0 = local_11c;
          local_1a8 = local_124;
          w_00.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff7a0;
          w_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff79c;
          w_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7a4;
          AbsCosTheta(w_00);
          SampledSpectrum::SampledSpectrum
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                     (Float)((ulong)in_stack_fffffffffffff788 >> 0x20));
          if (local_40 == 0) {
            Sqr<float>(local_128);
            SampledSpectrum::operator/=
                      ((SampledSpectrum *)
                       CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                       in_stack_fffffffffffff79c);
          }
          local_1e8 = local_18c;
          uStack_1e0 = uStack_184;
          local_1f0 = local_11c;
          local_1f8 = local_124;
          f_02.values.values[2] = (float)(undefined4)uStack_184;
          f_02.values.values[3] = (float)uStack_184._4_4_;
          f_02.values.values[0] = (float)(undefined4)local_18c;
          f_02.values.values[1] = (float)local_18c._4_4_;
          local_200 = local_11c;
          local_208 = local_124;
          wi_06.super_Tuple3<pbrt::Vector3,_float>.z = local_11c;
          wi_06.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_124;
          wi_06.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_124._4_4_;
          BSDFSample::BSDFSample
                    (&local_1d4,f_02,wi_06,local_74 / (local_70 + local_74),SpecularTransmission,
                     local_128,false);
          pstd::optional<pbrt::BSDFSample>::optional
                    ((optional<pbrt::BSDFSample> *)
                     CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                     in_stack_fffffffffffff788);
        }
      }
      else {
        Vector3<float>::Vector3
                  ((Vector3<float> *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                   (float)((ulong)in_stack_fffffffffffff788 >> 0x20),
                   SUB84(in_stack_fffffffffffff788,0),0.0);
        local_98 = local_78;
        local_a0 = local_80;
        local_a8 = local_78;
        local_b0 = local_80;
        w.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff7a0;
        w.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff79c;
        w.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7a4;
        AbsCosTheta(w);
        SampledSpectrum::SampledSpectrum
                  ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                   (Float)((ulong)in_stack_fffffffffffff788 >> 0x20));
        local_f8 = local_90;
        uStack_f0 = uStack_88;
        local_100 = local_78;
        local_108 = local_80;
        f_03.values.values[2] = (float)(undefined4)uStack_88;
        f_03.values.values[3] = (float)uStack_88._4_4_;
        f_03.values.values[0] = (float)(undefined4)local_90;
        f_03.values.values[1] = (float)local_90._4_4_;
        local_110 = local_78;
        local_118 = local_80;
        wi_07.super_Tuple3<pbrt::Vector3,_float>.z = local_78;
        wi_07.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_80;
        wi_07.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_80._4_4_;
        BSDFSample::BSDFSample
                  (&local_dc,f_03,wi_07,local_70 / (local_70 + local_74),SpecularReflection,1.0,
                   false);
        pstd::optional<pbrt::BSDFSample>::optional
                  ((optional<pbrt::BSDFSample> *)
                   CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                   in_stack_fffffffffffff788);
      }
    }
    else {
      memset(in_RDI,0,0x30);
      pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
    }
  }
  else {
    local_220 = local_10;
    local_228 = local_18;
    local_230 = local_30;
    local_238 = local_10;
    local_240 = local_18;
    auVar11 = ZEXT856(0);
    VVar12.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffa9c;
    VVar12.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffa98;
    VVar12.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffaa0;
    VVar12 = TrowbridgeReitzDistribution::Sample_wm
                       ((TrowbridgeReitzDistribution *)
                        CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),VVar12,
                        (Point2f)in_stack_fffffffffffffa80);
    local_288 = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar9._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar9._8_56_ = auVar11;
    local_290 = vmovlpd_avx(auVar9._0_16_);
    local_258 = local_10;
    local_260 = local_18;
    local_278 = local_10;
    local_280 = local_18;
    v_04.super_Tuple3<pbrt::Vector3,_float>.z = local_10;
    v_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_18;
    v_04.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_18._4_4_;
    w_13.super_Tuple3<pbrt::Vector3,_float>.z = local_288;
    w_13.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_290;
    w_13.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)local_290 >> 0x20);
    local_270 = local_290;
    local_268 = local_288;
    local_250 = local_290;
    local_248 = local_288;
    local_218 = local_290;
    local_210 = local_288;
    Dot<float>(v_04,w_13);
    local_298 = FrDielectric(in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c);
    local_29c = 1.0 - local_298;
    local_294 = local_29c;
    local_254 = local_298;
    iVar4 = operator&(local_44,Reflection);
    if (iVar4 == 0) {
      local_298 = 0.0;
    }
    iVar4 = operator&(local_44,Transmission);
    if (iVar4 == 0) {
      local_29c = 0.0;
    }
    if (((local_298 != 0.0) || (NAN(local_298))) || ((local_29c != 0.0 || (NAN(local_29c))))) {
      if (local_298 / (local_298 + local_29c) <= local_3c) {
        Vector3<float>::Vector3((Vector3<float> *)0x873255);
        local_4f0 = local_10;
        local_4f8 = local_18;
        local_508 = local_210;
        local_510 = local_218;
        local_518 = local_210;
        local_520 = local_218;
        v.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff7a0;
        v.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff79c;
        v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7a4;
        Normal3<float>::Normal3<float>((Normal3<float> *)0x8732ce,v);
        local_528 = local_4f0;
        local_530 = local_4f8;
        local_538 = local_4fc;
        local_540 = local_504;
        wi_04.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff91c;
        wi_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff918;
        wi_04.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff920;
        n_01.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffff8fc;
        n_01.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffff8f8;
        n_01.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff900;
        bVar1 = Refract(wi_04,n_01,in_stack_fffffffffffff8e4,
                        (Float *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                        in_stack_fffffffffffff8d0);
        local_4e9 = (bVar1 ^ 0xffU) & 1;
        if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
             ::reg == '\0') &&
           (iVar4 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                         ::reg), iVar4 != 0)) {
          Sample_f(pbrt::Vector3,float,pbrt::Point2,pbrt::TransportMode,pbrt::BxDFReflTransFlags)_const
          ::$_1::operator_cast_to_function_pointer(&local_541);
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0)
                     ,(AccumFunc)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                     in_stack_fffffffffffff7b0);
          __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                               ::reg);
        }
        *(long *)(*in_FS_OFFSET + -0x68) = *(long *)(*in_FS_OFFSET + -0x68) + 1;
        if ((local_4e9 & 1) != 0) {
          *(long *)(*in_FS_OFFSET + -0x70) = *(long *)(*in_FS_OFFSET + -0x70) + 1;
        }
        w_09.super_Tuple3<pbrt::Vector3,_float>.z = local_10;
        w_09.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_18;
        w_09.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_18._4_4_;
        wp.super_Tuple3<pbrt::Vector3,_float>.z = local_4e0;
        wp.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_4e8;
        wp.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_4e8._4_4_;
        bVar1 = SameHemisphere(w_09,wp);
        if ((bVar1) || (((local_4e0 == 0.0 && (!NAN(local_4e0))) || ((local_4e9 & 1) != 0)))) {
          memset(in_RDI,0,0x30);
          pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
        }
        else {
          v_03.super_Tuple3<pbrt::Vector3,_float>.z = local_4e0;
          v_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_4e8;
          v_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_4e8._4_4_;
          w_08.super_Tuple3<pbrt::Vector3,_float>.z = local_210;
          w_08.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_218;
          w_08.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_218._4_4_;
          fVar7 = Dot<float>(v_03,w_08);
          v_02.super_Tuple3<pbrt::Vector3,_float>.z = local_10;
          v_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_18;
          v_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_18._4_4_;
          w_07.super_Tuple3<pbrt::Vector3,_float>.z = local_210;
          w_07.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_218;
          w_07.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_218._4_4_;
          fVar8 = Dot<float>(v_02,w_07);
          fVar7 = Sqr<float>(fVar7 + fVar8 / local_4dc);
          v1_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7f0;
          v1_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff7e8;
          v2_00.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_RDI;
          v2_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff7cc;
          fVar8 = AbsDot<float>(v1_00,v2_00);
          w_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff800;
          w_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff7f8;
          w_02.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20);
          wm_01.super_Tuple3<pbrt::Vector3,_float>.z = fVar6;
          wm_01.super_Tuple3<pbrt::Vector3,_float>._0_8_ = poVar13;
          FVar5 = TrowbridgeReitzDistribution::PDF
                            ((TrowbridgeReitzDistribution *)
                             CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),w_02,
                             wm_01);
          local_2a0 = (FVar5 * (fVar8 / fVar7) * local_29c) / (local_298 + local_29c);
          eVar2 = IsNaN<float>(0.0);
          if (eVar2) {
            LogFatal<char_const(&)[12]>
                      (in_stack_fffffffffffff7f4,in_stack_fffffffffffff7e8,iVar3,(char *)poVar13,
                       (char (*) [12])in_RDI);
          }
          v_05 = (BSDFSample *)(CONCAT44(iVar3,fVar6) + 4);
          fVar7 = local_294;
          TrowbridgeReitzDistribution::D
                    (in_stack_fffffffffffff820,(Vector3f)in_stack_fffffffffffff838);
          iVar3 = (int)v_05;
          wo_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff810;
          wo_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff808;
          wo_01.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)in_stack_fffffffffffff808 >> 0x20);
          wi_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7f0;
          wi_01.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff7e8;
          TrowbridgeReitzDistribution::G((TrowbridgeReitzDistribution *)in_RDI,wo_01,wi_01);
          v_01.super_Tuple3<pbrt::Vector3,_float>.z = local_4e0;
          v_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_4e8;
          v_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_4e8._4_4_;
          w_06.super_Tuple3<pbrt::Vector3,_float>.z = local_210;
          w_06.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_218;
          w_06.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_218._4_4_;
          fVar8 = Dot<float>(v_01,w_06);
          v_00.super_Tuple3<pbrt::Vector3,_float>.z = local_10;
          v_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_18;
          v_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_18._4_4_;
          w_05.super_Tuple3<pbrt::Vector3,_float>.z = local_210;
          w_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_218;
          w_05.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_218._4_4_;
          fVar6 = Dot<float>(v_00,w_05);
          fVar6 = fVar8 * fVar6;
          w_04.super_Tuple3<pbrt::Vector3,_float>.z = local_4e0;
          w_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_4e8;
          w_04.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_4e8._4_4_;
          FVar5 = CosTheta(w_04);
          w_03.super_Tuple3<pbrt::Vector3,_float>.z = local_10;
          w_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_18;
          w_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_18._4_4_;
          CosTheta(w_03);
          std::abs(iVar3);
          SampledSpectrum::SampledSpectrum
                    ((SampledSpectrum *)CONCAT44(fVar7,in_stack_fffffffffffff790),
                     (Float)((ulong)v_05 >> 0x20));
          if (local_40 == 0) {
            Sqr<float>(local_4dc);
            SampledSpectrum::operator/=((SampledSpectrum *)CONCAT44(fVar6,FVar5),fVar8);
          }
          fStack_7ec = (float)((ulong)uStack_688 >> 0x20);
          f_00.values.values[2] = (float)(int)uStack_688;
          f_00.values.values._0_8_ = local_690;
          f_00.values.values[3] = fStack_7ec;
          wi_02.super_Tuple3<pbrt::Vector3,_float>.z = local_4e0;
          wi_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_4e8;
          wi_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_4e8._4_4_;
          BSDFSample::BSDFSample
                    ((BSDFSample *)&stack0xfffffffffffff824,f_00,wi_02,local_2a0,GlossyTransmission,
                     local_4dc,false);
          pstd::optional<pbrt::BSDFSample>::optional
                    ((optional<pbrt::BSDFSample> *)CONCAT44(fVar7,in_stack_fffffffffffff790),v_05);
        }
      }
      else {
        local_2b8 = local_10;
        local_2c0 = local_18;
        local_2c8 = local_210;
        local_2d0 = local_218;
        local_2d8 = local_10;
        local_2e0 = local_18;
        auVar11 = ZEXT856(0);
        local_2e8 = local_210;
        local_2f0 = local_218;
        wo_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff88c;
        wo_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff888;
        wo_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff890;
        n.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff86c;
        n.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff868;
        n.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff870;
        VVar12 = Reflect(wo_02,n);
        local_338 = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar10._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar10._8_56_ = auVar11;
        local_340 = vmovlpd_avx(auVar10._0_16_);
        local_308 = local_10;
        local_310 = local_18;
        local_328 = local_10;
        local_330 = local_18;
        w_12.super_Tuple3<pbrt::Vector3,_float>.z = local_10;
        w_12.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_18;
        w_12.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_18._4_4_;
        wp_00.super_Tuple3<pbrt::Vector3,_float>.z = local_338;
        wp_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_340;
        wp_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)local_340 >> 0x20);
        local_320 = local_340;
        local_318 = local_338;
        local_300 = local_340;
        local_2f8 = local_338;
        local_2b0 = local_340;
        local_2a8 = local_338;
        bVar1 = SameHemisphere(w_12,wp_00);
        if (bVar1) {
          local_348 = local_10;
          local_350 = local_18;
          local_358 = local_210;
          local_360 = local_218;
          local_368 = local_10;
          local_370 = local_18;
          local_378 = local_210;
          local_380 = local_218;
          w_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff800;
          w_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff7f8;
          w_01.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20);
          wm_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar6;
          wm_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = poVar13;
          FVar5 = TrowbridgeReitzDistribution::PDF
                            ((TrowbridgeReitzDistribution *)
                             CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),w_01,
                             wm_00);
          local_388 = local_10;
          local_390 = local_18;
          local_398 = local_210;
          local_3a0 = local_218;
          local_3a8 = local_10;
          local_3b0 = local_18;
          local_3b8 = local_210;
          local_3c0 = local_218;
          v1.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7f0;
          v1.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff7e8;
          v2.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_RDI;
          v2.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff7cc;
          fVar6 = AbsDot<float>(v1,v2);
          local_2a0 = ((FVar5 / (fVar6 * 4.0)) * local_298) / (local_298 + local_29c);
          local_3d8 = local_210;
          local_3e0 = local_218;
          local_3e8 = local_210;
          local_3f0 = local_218;
          TrowbridgeReitzDistribution::D
                    (in_stack_fffffffffffff820,(Vector3f)in_stack_fffffffffffff838);
          local_3f8 = local_10;
          local_400 = local_18;
          local_408 = local_2a8;
          local_410 = local_2b0;
          local_418 = local_10;
          local_420 = local_18;
          local_428 = local_2a8;
          local_430 = local_2b0;
          wo_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff810;
          wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff808;
          wo_00.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)in_stack_fffffffffffff808 >> 0x20);
          wi_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7f0;
          wi_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff7e8;
          TrowbridgeReitzDistribution::G((TrowbridgeReitzDistribution *)in_RDI,wo_00,wi_00);
          local_438 = local_2a8;
          local_440 = local_2b0;
          local_448 = local_2a8;
          local_450 = local_2b0;
          w_11.super_Tuple3<pbrt::Vector3,_float>.z = local_2a8;
          w_11.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_2b0;
          w_11.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2b0._4_4_;
          CosTheta(w_11);
          local_458 = local_10;
          local_460 = local_18;
          local_468 = local_10;
          local_470 = local_18;
          w_10.super_Tuple3<pbrt::Vector3,_float>.z = local_10;
          w_10.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_18;
          w_10.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_18._4_4_;
          CosTheta(w_10);
          SampledSpectrum::SampledSpectrum
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                     (Float)((ulong)in_stack_fffffffffffff788 >> 0x20));
          local_4b8 = local_3d0;
          uStack_4b0 = uStack_3c8;
          local_4c0 = local_2a8;
          local_4c8 = local_2b0;
          f_01.values.values[2] = (float)(undefined4)uStack_3c8;
          f_01.values.values[3] = (float)uStack_3c8._4_4_;
          f_01.values.values[0] = (float)(undefined4)local_3d0;
          f_01.values.values[1] = (float)local_3d0._4_4_;
          local_4d0 = local_2a8;
          local_4d8 = local_2b0;
          wi_05.super_Tuple3<pbrt::Vector3,_float>.z = local_2a8;
          wi_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_2b0;
          wi_05.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2b0._4_4_;
          BSDFSample::BSDFSample(&local_49c,f_01,wi_05,local_2a0,GlossyReflection,1.0,false);
          pstd::optional<pbrt::BSDFSample>::optional
                    ((optional<pbrt::BSDFSample> *)
                     CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                     in_stack_fffffffffffff788);
        }
        else {
          memset(in_RDI,0,0x30);
          pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
        }
      }
    }
    else {
      memset(in_RDI,0,0x30);
      pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
    }
  }
  return poVar13;
}

Assistant:

PBRT_CPU_GPU pstd::optional<BSDFSample> DielectricBxDF::Sample_f(
    Vector3f wo, Float uc, Point2f u, TransportMode mode,
    BxDFReflTransFlags sampleFlags) const {
    if (eta == 1 || mfDistrib.EffectivelySmooth()) {
        // Sample perfect specular dielectric BSDF
        Float R = FrDielectric(CosTheta(wo), eta), T = 1 - R;
        // Compute probabilities _pr_ and _pt_ for sampling reflection and transmission
        Float pr = R, pt = T;
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;
        if (pr == 0 && pt == 0)
            return {};

        if (uc < pr / (pr + pt)) {
            // Sample perfect specular dielectric BRDF
            Vector3f wi(-wo.x, -wo.y, wo.z);
            SampledSpectrum fr(R / AbsCosTheta(wi));
            return BSDFSample(fr, wi, pr / (pr + pt), BxDFFlags::SpecularReflection);

        } else {
            // Sample perfect specular dielectric BTDF
            // Compute ray direction for specular transmission
            Vector3f wi;
            Float etap;
            bool valid = Refract(wo, Normal3f(0, 0, 1), eta, &etap, &wi);
            CHECK_RARE(1e-5f, !valid);
            if (!valid)
                return {};

            SampledSpectrum ft(T / AbsCosTheta(wi));
            // Account for non-symmetry with transmission to different medium
            if (mode == TransportMode::Radiance)
                ft /= Sqr(etap);

            return BSDFSample(ft, wi, pt / (pr + pt), BxDFFlags::SpecularTransmission,
                              etap);
        }

    } else {
        // Sample rough dielectric BSDF
        Vector3f wm = mfDistrib.Sample_wm(wo, u);
        Float R = FrDielectric(Dot(wo, wm), eta);
        Float T = 1 - R;
        // Compute probabilities _pr_ and _pt_ for sampling reflection and transmission
        Float pr = R, pt = T;
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;
        if (pr == 0 && pt == 0)
            return {};

        Float pdf;
        if (uc < pr / (pr + pt)) {
            // Sample reflection at rough dielectric interface
            Vector3f wi = Reflect(wo, wm);
            if (!SameHemisphere(wo, wi))
                return {};
            // Compute PDF of rough dielectric reflection
            pdf = mfDistrib.PDF(wo, wm) / (4 * AbsDot(wo, wm)) * pr / (pr + pt);

            DCHECK(!IsNaN(pdf));
            SampledSpectrum f(mfDistrib.D(wm) * mfDistrib.G(wo, wi) * R /
                              (4 * CosTheta(wi) * CosTheta(wo)));
            return BSDFSample(f, wi, pdf, BxDFFlags::GlossyReflection);

        } else {
            // Sample transmission at rough dielectric interface
            Float etap;
            Vector3f wi;
            bool tir = !Refract(wo, (Normal3f)wm, eta, &etap, &wi);
            CHECK_RARE(1e-5f, tir);
            if (SameHemisphere(wo, wi) || wi.z == 0 || tir)
                return {};
            // Compute PDF of rough dielectric transmission
            Float denom = Sqr(Dot(wi, wm) + Dot(wo, wm) / etap);
            Float dwm_dwi = AbsDot(wi, wm) / denom;
            pdf = mfDistrib.PDF(wo, wm) * dwm_dwi * pt / (pr + pt);

            CHECK(!IsNaN(pdf));
            // Evaluate BRDF and return _BSDFSample_ for rough transmission
            SampledSpectrum ft(T * mfDistrib.D(wm) * mfDistrib.G(wo, wi) *
                               std::abs(Dot(wi, wm) * Dot(wo, wm) /
                                        (CosTheta(wi) * CosTheta(wo) * denom)));
            // Account for non-symmetry with transmission to different medium
            if (mode == TransportMode::Radiance)
                ft /= Sqr(etap);

            return BSDFSample(ft, wi, pdf, BxDFFlags::GlossyTransmission, etap);
        }
    }
}